

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O3

uint64_t bitmanip::detail::ileaveBytes_jmp(uint64_t bytes,size_t count)

{
  uint64_t uVar1;
  
  uVar1 = (*(code *)(&DAT_00115330 + *(int *)(&DAT_00115330 + count * 4)))();
  return uVar1;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t ileaveBytes_jmp(std::uint64_t bytes, std::size_t count) noexcept
{
    BITMANIP_ASSUME(count <= 8);

    switch (count) {
    case 0: return ileaveBytes_const<0>(bytes);
    case 1: return ileaveBytes_const<1>(bytes);
    case 2: return ileaveBytes_const<2>(bytes);
    case 3: return ileaveBytes_const<3>(bytes);
    case 4: return ileaveBytes_const<4>(bytes);
    case 5: return ileaveBytes_const<5>(bytes);
    case 6: return ileaveBytes_const<6>(bytes);
    case 7: return ileaveBytes_const<7>(bytes);
    case 8: return ileaveBytes_const<8>(bytes);
    }
    BITMANIP_UNREACHABLE();
}